

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

void __thiscall
QDir::QDir(QDir *this,QString *path,QString *nameFilter,SortFlags sort,Filters filters)

{
  QDirPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDirPrivate *)operator_new(0x118);
  QDirPrivate::splitFilters((QStringList *)&local_50,nameFilter,(QChar)0x0);
  QDirPrivate::QDirPrivate(this_00,path,(QStringList *)&local_50,sort,filters);
  (this->d_ptr).d.ptr = this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDir::QDir(const QString &path, const QString &nameFilter,
           SortFlags sort, Filters filters)
    : d_ptr(new QDirPrivate(path, QDir::nameFiltersFromString(nameFilter), sort, filters))
{
}